

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmemory.cpp
# Opt level: O0

BOOL SHMAddSegment(void)

{
  BOOL BVar1;
  int num_blocks;
  undefined1 *val;
  int *piVar2;
  void *pvVar3;
  SHMPTR val_00;
  unsigned_long uVar4;
  void *pvVar5;
  int num_new_items;
  int new_pool_size;
  int used_pool_size;
  int current_pool_size;
  int new_size;
  int used_size;
  int sps;
  SHMPTR *shmptr_ptr;
  SHMPTR first_shmptr;
  SHM_FIRST_HEADER *first_header;
  SHM_SEGMENT_HEADER *header;
  LPVOID segment_base;
  
  BVar1 = SHMMapUnknownSegments();
  if (BVar1 == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    segment_base._4_4_ = 0;
  }
  else if (shm_numsegments == 0x100) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    segment_base._4_4_ = 0;
  }
  else {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    val = (undefined1 *)mmap64((void *)0x0,0x40000,3,0x22,-1,0);
    if (val == &DAT_ffffffffffffffff) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      piVar2 = __errno_location();
      strerror(*piVar2);
      segment_base._4_4_ = 0;
    }
    else {
      Volatile<void_*>::operator=(shm_segment_bases + shm_numsegments,val);
      Volatile<void_*>::Load(shm_segment_bases + (shm_numsegments + -1));
      pvVar3 = Volatile<void_*>::Load(shm_segment_bases);
      current_pool_size = 0;
      for (new_size = 0; new_size < 4; new_size = new_size + 1) {
        current_pool_size =
             (*(int *)((long)pvVar3 + (long)new_size * 0x18 + 0x4c) * block_sizes[new_size] +
             current_pool_size) -
             *(int *)((long)pvVar3 + (long)new_size * 0x18 + 0x50) * block_sizes[new_size];
      }
      used_pool_size = 0x3ffc0;
      shmptr_ptr = (SHMPTR *)((long)(shm_numsegments << 0x18) | 0x40);
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      for (new_size = 0; new_size < 4; new_size = new_size + 1) {
        used_pool_size = used_pool_size - block_sizes[new_size];
      }
      for (new_size = 0; new_size < 4; new_size = new_size + 1) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        num_blocks = (int)(((long)(*(int *)((long)pvVar3 + (long)new_size * 0x18 + 0x4c) *
                                   block_sizes[new_size] -
                                  *(int *)((long)pvVar3 + (long)new_size * 0x18 + 0x50) *
                                  block_sizes[new_size]) * (long)used_pool_size) /
                          (long)current_pool_size) / block_sizes[new_size] + 1;
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        Volatile<unsigned_long>::operator=
                  ((Volatile<unsigned_long> *)(val + (long)new_size * 8),(unsigned_long)shmptr_ptr);
        val_00 = SHMLinkPool((SHMPTR)shmptr_ptr,block_sizes[new_size],num_blocks);
        Volatile<unsigned_long>::operator=
                  ((Volatile<unsigned_long> *)(val + (long)new_size * 8 + 0x20),val_00);
        uVar4 = Volatile::operator_cast_to_unsigned_long
                          ((Volatile *)(val + (long)new_size * 8 + 0x20));
        pvVar5 = Volatile<void_*>::Load(shm_segment_bases + (uVar4 >> 0x18 & 0xff));
        uVar4 = Volatile::operator_cast_to_unsigned_long
                          ((Volatile *)(val + (long)new_size * 8 + 0x20));
        *(undefined8 *)((long)pvVar5 + (uVar4 & 0xffffff)) =
             *(undefined8 *)((long)pvVar3 + (long)new_size * 0x18 + 0x58);
        uVar4 = Volatile::operator_cast_to_unsigned_long((Volatile *)(val + (long)new_size * 8));
        *(unsigned_long *)((long)pvVar3 + (long)new_size * 0x18 + 0x58) = uVar4;
        *(int *)((long)pvVar3 + (long)new_size * 0x18 + 0x50) =
             num_blocks + *(int *)((long)pvVar3 + (long)new_size * 0x18 + 0x50);
        *(int *)((long)pvVar3 + (long)new_size * 0x18 + 0x4c) =
             num_blocks + *(int *)((long)pvVar3 + (long)new_size * 0x18 + 0x4c);
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        shmptr_ptr = (SHMPTR *)((long)(num_blocks * block_sizes[new_size]) + (long)shmptr_ptr);
      }
      shm_numsegments = shm_numsegments + 1;
      segment_base._4_4_ = 1;
    }
  }
  return segment_base._4_4_;
}

Assistant:

static BOOL SHMAddSegment(void)
{
    LPVOID segment_base;
    SHM_SEGMENT_HEADER *header;
    SHM_FIRST_HEADER *first_header;
    SHMPTR first_shmptr;
    SHMPTR *shmptr_ptr;
    int sps;
    int used_size;
    int new_size;
    int current_pool_size;
    int used_pool_size;
    int new_pool_size;
    int num_new_items;

    /* Map all segments this process doesn't yet know about, so we link the new
       segment at the right place */
    if(!SHMMapUnknownSegments())
    {
        ERROR("SHMMapUnknownSegments failed!\n");
        return FALSE;
    }

    /* Avoid overflowing */
    if(shm_numsegments == MAX_SEGMENTS)
    {
        ERROR("Can't map more segments : maximum number (%d) reached!\n",
              MAX_SEGMENTS);
        return FALSE;
    }

    TRACE("Creating SHM segment #%d\n", shm_numsegments);

    segment_base = mmap(NULL, segment_size, PROT_READ|PROT_WRITE,
                        MAP_ANON|MAP_PRIVATE,-1, 0);

    if(segment_base == MAP_FAILED)
    {
        ERROR("mmap() failed! error is %d (%s)\n", errno, strerror(errno));
        return FALSE;
    }

    shm_segment_bases[shm_numsegments] = segment_base;

    /* Save name (well, suffix) of new segment in the header of the old last
       segment, so that other processes know where it is. */
    header = (SHM_SEGMENT_HEADER *)shm_segment_bases[shm_numsegments-1].Load();

    /* Indicate that the new segment is the last one */
    header = (SHM_SEGMENT_HEADER *)segment_base;

    /* We're now ready to update our memory pools */

    first_header = (SHM_FIRST_HEADER *)shm_segment_bases[0].Load();

    /* Calculate total amount of used memory (in bytes) */
    used_size = 0;
    for(sps = 0; sps<SPS_LAST;sps++)
    {
        /* Add total size of this pool */
        used_size += first_header->pools[sps].num_items*block_sizes[sps];

        /* Remove unused size of this pool */
        used_size -= first_header->pools[sps].free_items*block_sizes[sps];
    }

    /* Determine how to divide the new segment between the pools for the
       different block sizes, then update the pool inforamtion accordingly
       Allocation strategy :
       1) Calculate the proportion of used memory used by each pool
       2) Allocate this proportion of the new segment to each pool
     */

    /* Add the new segment to the total amount of SHM memory */
    new_size = segment_size-roundup(sizeof(SHM_SEGMENT_HEADER), sizeof(INT64));

    /* Calculate value of first SHMPTR in the new segment : segment is
       shm_numsegments (not yet incremented); offset is the first byte after
       the segment header */
    first_shmptr = MAKE_SHMPTR(shm_numsegments,roundup(sizeof(SHM_SEGMENT_HEADER), sizeof(INT64)));

    TRACE("Updating SHM pool information; Total memory used is %d bytes; "
          "we are adding %d bytes\n", used_size, new_size);

    /* We want to allocate at least 1 block of each size (to avoid adding
       special cases everywhere). We remove the required space for these blocks
       from the size used in the calculations, then add 1 to each block count */
    for(sps=0;sps<SPS_LAST;sps++)
        new_size -= block_sizes[sps];

    /* Loop through all block sizes */
    for(sps=0; sps<SPS_LAST; sps++)
    {
        TRACE("Now processing block size \"%d\"...\n", block_sizes[sps]);
        /* amount of memory currently reserved for this block size */
        current_pool_size = first_header->pools[sps].num_items*block_sizes[sps];

        /* how much of that is actually used? */
        used_pool_size = current_pool_size -
                         first_header->pools[sps].free_items*block_sizes[sps];

        DBGOUT("%d bytes of %d bytes used (%d%%)\n", used_pool_size,
               current_pool_size, (used_pool_size*100)/current_pool_size);

        /* amount of memory we want to add to the pool for this block size :
           amount used by this pool/total amount used * new segment's size */
        new_pool_size = (((LONGLONG)used_pool_size)*new_size)/used_size;

        DBGOUT("Allocating %d bytes of %d to %d-byte pool\n",
               new_pool_size, new_size, block_sizes[sps]);

        /* determine the number of blocks that can fit in the chosen amount */
        num_new_items = new_pool_size/block_sizes[sps];

        /* make sure we allocate at least 1 block of each size */
        num_new_items +=1;

        DBGOUT("Adding %d new blocks\n", num_new_items);

        /* Save the first and last block of the current block size in the new
           segment; join all blocks in between in a linked list */
        header->first_pool_blocks[sps] = first_shmptr;
        header->last_pool_blocks[sps] = SHMLinkPool(first_shmptr,
                                                    block_sizes[sps],
                                                    num_new_items);

        /* Link the last block in the new linked list to the first block of the
           old global linked list. We don't use SHMPTR_TO_PTR because the pool
           data isn't updated yet */
        shmptr_ptr = reinterpret_cast<SHMPTR*>(
            static_cast<LPBYTE>(shm_segment_bases[SHMPTR_SEGMENT(header->last_pool_blocks[sps])].Load()) +
                     SHMPTR_OFFSET(header->last_pool_blocks[sps]));

        *shmptr_ptr = first_header->pools[sps].first_free;

        /* Save the first block of the new linked list as the new beginning of
           the global linked list; the global list now contains all new blocks
           AND all blocks that were already free */
        first_header->pools[sps].first_free = header->first_pool_blocks[sps];

        /* Update block counts to include new blocks */
        first_header->pools[sps].free_items+=num_new_items;
        first_header->pools[sps].num_items+=num_new_items;

        DBGOUT("There are now %d %d-byte blocks, %d are free\n",
               first_header->pools[sps].num_items, block_sizes[sps],
               first_header->pools[sps].free_items);

        /* Update first_shmptr to first byte after the new pool */
        first_shmptr+=num_new_items*block_sizes[sps];
    }
    shm_numsegments++;

    return TRUE;
}